

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O0

void tty_update_flags(EditLine *el,wchar_t kind)

{
  tcflag_t tVar1;
  tcflag_t *ptVar2;
  tcflag_t *ptVar3;
  tcflag_t *ptVar4;
  tcflag_t *ex;
  tcflag_t *ed;
  tcflag_t *tt;
  wchar_t kind_local;
  EditLine *el_local;
  
  ptVar2 = tty__get_flag(&(el->el_tty).t_ts,kind);
  ptVar3 = tty__get_flag(&(el->el_tty).t_ed,kind);
  ptVar4 = tty__get_flag(&(el->el_tty).t_ex,kind);
  if ((*ptVar2 != *ptVar4) && ((kind != L'\x02' || (*ptVar2 != *ptVar3)))) {
    tVar1 = tty_update_flag(el,*ptVar2,L'\x01',kind);
    *ptVar3 = tVar1;
    tVar1 = tty_update_flag(el,*ptVar2,L'\0',kind);
    *ptVar4 = tVar1;
  }
  return;
}

Assistant:

static void
tty_update_flags(EditLine *el, int kind)
{
	tcflag_t *tt, *ed, *ex;
	tt = tty__get_flag(&el->el_tty.t_ts, kind);
	ed = tty__get_flag(&el->el_tty.t_ed, kind);
	ex = tty__get_flag(&el->el_tty.t_ex, kind);

	if (*tt != *ex && (kind != MD_CTL || *tt != *ed)) {
		*ed = tty_update_flag(el, *tt, ED_IO, kind);
		*ex = tty_update_flag(el, *tt, EX_IO, kind);
	}
}